

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.cpp
# Opt level: O1

void __thiscall
UrlParserTest::http_url_with_username_and_port::test_method(http_url_with_username_and_port *this)

{
  string *psVar1;
  int iVar2;
  undefined1 local_320 [8];
  UrlParser parser;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  _Alloc_hider *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  shared_count sStack_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined8 *local_b8;
  _Alloc_hider *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  char *local_90;
  string local_88;
  undefined1 local_62 [3];
  undefined7 uStack_5f;
  undefined8 local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  string *local_40;
  _Alloc_hider local_38;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "http://username:passwd@www.example.com:8080/dir/subdir?param=1&param=2;param%20=%20#fragment"
             ,"");
  httpparser::UrlParser::UrlParser((UrlParser *)local_320,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  parser.url._256_8_ = anon_var_dwarf_7266;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&parser.url.integerPort,0x57);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_f0 = &local_38;
  local_38._M_p._0_1_ = local_320[0];
  local_40 = (string *)local_62;
  local_62[0] = 1;
  local_62[2] = local_320[0];
  local_58 = 0;
  aStack_50._M_allocated_capacity = 0;
  local_88.field_2._8_8_ = &local_f0;
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179a0;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_c0 = 0;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_d8 = "";
  local_c8 = &PTR__lazy_ostream_001179a0;
  local_b0 = (_Alloc_hider *)&local_40;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_50._M_allocated_capacity);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1e8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x58);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  psVar1 = (string *)(local_62 + 2);
  httpparser::UrlParser::scheme_abi_cxx11_(psVar1,(UrlParser *)local_320);
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  local_e0 = (char *)CONCAT71(local_e0._1_7_,iVar2 == 0);
  local_d8 = (char *)0x0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (_Alloc_hider *)0x113056;
  local_e8 = "";
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_88.field_2._8_8_ = &local_40;
  local_38._M_p = "http";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00117a20;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_38;
  local_40 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_a8,&local_f0,0x58,1,2,2,"parser.scheme()",&local_88,"\"http\"",
             &local_c8);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_5f,local_62[2]) != &aStack_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_5f,local_62[2]),aStack_50._M_allocated_capacity + 1);
  }
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1c8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x59);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  psVar1 = (string *)(local_62 + 2);
  httpparser::UrlParser::username_abi_cxx11_(psVar1,(UrlParser *)local_320);
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  local_e0 = (char *)CONCAT71(local_e0._1_7_,iVar2 == 0);
  local_d8 = (char *)0x0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (_Alloc_hider *)0x113056;
  local_e8 = "";
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_88.field_2._8_8_ = &local_40;
  local_38._M_p = "username";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00117b20;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_38;
  local_40 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_a8,&local_f0,0x59,1,2,2,"parser.username()",&local_88,"\"username\"",
             &local_c8);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_5f,local_62[2]) != &aStack_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_5f,local_62[2]),aStack_50._M_allocated_capacity + 1);
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1a8 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x5a);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  psVar1 = (string *)(local_62 + 2);
  httpparser::UrlParser::password_abi_cxx11_(psVar1,(UrlParser *)local_320);
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  local_e0 = (char *)CONCAT71(local_e0._1_7_,iVar2 == 0);
  local_d8 = (char *)0x0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (_Alloc_hider *)0x113056;
  local_e8 = "";
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_88.field_2._8_8_ = &local_40;
  local_38._M_p = "passwd";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00117c20;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_38;
  local_40 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_a8,&local_f0,0x5a,1,2,2,"parser.password()",&local_88,"\"passwd\"",
             &local_c8);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_5f,local_62[2]) != &aStack_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_5f,local_62[2]),aStack_50._M_allocated_capacity + 1);
  }
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_188 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x5b);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  psVar1 = (string *)(local_62 + 2);
  httpparser::UrlParser::hostname_abi_cxx11_(psVar1,(UrlParser *)local_320);
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  local_e0 = (char *)CONCAT71(local_e0._1_7_,iVar2 == 0);
  local_d8 = (char *)0x0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (_Alloc_hider *)0x113056;
  local_e8 = "";
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_88.field_2._8_8_ = &local_40;
  local_38._M_p = "www.example.com";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00117a60;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_38;
  local_40 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_a8,&local_f0,0x5b,1,2,2,"parser.hostname()",&local_88,
             "\"www.example.com\"",&local_c8);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_5f,local_62[2]) != &aStack_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_5f,local_62[2]),aStack_50._M_allocated_capacity + 1);
  }
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_168 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x5c);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  psVar1 = (string *)(local_62 + 2);
  httpparser::UrlParser::path_abi_cxx11_(psVar1,(UrlParser *)local_320);
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  local_e0 = (char *)CONCAT71(local_e0._1_7_,iVar2 == 0);
  local_d8 = (char *)0x0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (_Alloc_hider *)0x113056;
  local_e8 = "";
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_88.field_2._8_8_ = &local_40;
  local_38._M_p = "/dir/subdir";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00117aa0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_38;
  local_40 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_a8,&local_f0,0x5c,1,2,2,"parser.path()",&local_88,"\"/dir/subdir\"",
             &local_c8);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_5f,local_62[2]) != &aStack_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_5f,local_62[2]),aStack_50._M_allocated_capacity + 1);
  }
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_148 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x5d);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  psVar1 = (string *)(local_62 + 2);
  httpparser::UrlParser::query_abi_cxx11_(psVar1,(UrlParser *)local_320);
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  local_e0 = (char *)CONCAT71(local_e0._1_7_,iVar2 == 0);
  local_d8 = (char *)0x0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (_Alloc_hider *)0x113056;
  local_e8 = "";
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_88.field_2._8_8_ = &local_40;
  local_38._M_p = "param=1&param=2;param%20=%20";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00117ae0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_38;
  local_40 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_a8,&local_f0,0x5d,1,2,2,"parser.query()",&local_88,
             "\"param=1&param=2;param%20=%20\"",&local_c8);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_5f,local_62[2]) != &aStack_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_5f,local_62[2]),aStack_50._M_allocated_capacity + 1);
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_128 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x5e);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  psVar1 = (string *)(local_62 + 2);
  httpparser::UrlParser::fragment_abi_cxx11_(psVar1,(UrlParser *)local_320);
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  local_e0 = (char *)CONCAT71(local_e0._1_7_,iVar2 == 0);
  local_d8 = (char *)0x0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (_Alloc_hider *)0x113056;
  local_e8 = "";
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_88.field_2._8_8_ = &local_40;
  local_38._M_p = "fragment";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00117b20;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_38;
  local_40 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_a8,&local_f0,0x5e,1,2,2,"parser.fragment()",&local_88,"\"fragment\"",
             &local_c8);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_5f,local_62[2]) != &aStack_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_5f,local_62[2]),aStack_50._M_allocated_capacity + 1);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_108 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x5f);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_62._0_2_ = httpparser::UrlParser::httpPort((UrlParser *)local_320);
  local_62[2] = local_62._0_2_ == 0x1f90;
  local_38._M_p._0_4_ = 0x1f90;
  local_58 = 0;
  aStack_50._M_allocated_capacity = 0;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_d8 = "";
  local_f0 = (_Alloc_hider *)local_62;
  local_88._M_string_length._0_1_ = 0;
  local_88._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00117b60;
  local_88.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_40 = (string *)&local_38;
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00117ba0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = (_Alloc_hider *)&local_40;
  local_88.field_2._8_8_ = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (local_62 + 2,&local_a8,&local_e0,0x5f,1,2,2,"parser.httpPort()",&local_88,"8080",
             &local_c8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_50._M_allocated_capacity);
  httpparser::UrlParser::Url::~Url((Url *)&parser);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(http_url_with_username_and_port)
{
    const char *text = "http://username:passwd@www.example.com:8080/dir/subdir?param=1&param=2;param%20=%20#fragment";
    UrlParser parser(text);

    BOOST_CHECK_EQUAL(parser.isValid(), true);
    BOOST_CHECK_EQUAL(parser.scheme(), "http");
    BOOST_CHECK_EQUAL(parser.username(), "username");
    BOOST_CHECK_EQUAL(parser.password(), "passwd");
    BOOST_CHECK_EQUAL(parser.hostname(), "www.example.com");
    BOOST_CHECK_EQUAL(parser.path(), "/dir/subdir");
    BOOST_CHECK_EQUAL(parser.query(), "param=1&param=2;param%20=%20");
    BOOST_CHECK_EQUAL(parser.fragment(), "fragment");
    BOOST_CHECK_EQUAL(parser.httpPort(), 8080);
}